

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O2

double mpt::log(double __x)

{
  char in_AL;
  char *in_RCX;
  uint in_EDX;
  char *in_RSI;
  long in_RDI;
  double dVar1;
  double extraout_XMM0_Qa;
  va_list va;
  __va_list_tag local_d8;
  undefined1 local_b8 [48];
  double local_88;
  
  if (in_AL != '\0') {
    local_88 = __x;
  }
  if (in_RCX != (char *)0x0) {
    local_d8.reg_save_area = local_b8;
    local_d8.overflow_arg_area = &va[0].overflow_arg_area;
    local_d8.gp_offset = 0x20;
    local_d8.fp_offset = 0x30;
  }
  if (in_RDI == 0) {
    print_message(in_RSI,in_EDX,in_RCX,&local_d8);
    dVar1 = extraout_XMM0_Qa;
  }
  else {
    dVar1 = (double)mpt_convertable_vlog(in_RDI,in_RSI,in_EDX | 0x800);
  }
  return dVar1;
}

Assistant:

int log(convertable *dest, const char *fcn, int type, const char *fmt, ...)
{
	va_list va;
	if (fmt) va_start(va, fmt);
	int ret;
	if (dest) {
		ret = mpt_convertable_vlog(dest, fcn, type | logger::LogFunction, fmt, va);
	} else {
		ret = print_message(fcn, type, fmt, va);
	}
	if (fmt) va_end(va);
	return ret;
}